

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [33];
  byte local_1f;
  byte local_1e;
  byte local_1d;
  int local_1c;
  bool zip;
  bool index_file;
  bool skipheader;
  char **ppcStack_18;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1d = 0;
  local_1e = 0;
  local_1f = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  do {
    local_1c = getopt((int)argv_local,ppcStack_18,"vhsiz");
    if (local_1c == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"",&local_41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"",&local_79);
      initstreams((string *)local_40,(string *)local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if ((local_1f & 1) == 0) {
        doit((bool)(local_1d & 1),(bool)(local_1e & 1));
      }
      else {
        doitz((bool)(local_1d & 1));
      }
      return 0;
    }
    switch(local_1c) {
    case 0x68:
    default:
      help();
      exit(1);
    case 0x69:
      local_1e = 1;
      break;
    case 0x73:
      local_1d = 1;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*ppcStack_18,"");
      exit(1);
    case 0x7a:
      local_1f = 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	bool skipheader = false;
	bool index_file = false;
	bool zip = false;
	while ((opt = getopt(argc, argv, "vhsiz")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'i':
			index_file = true;
			break;
		case 'z':
			zip = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			::exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	initstreams();
	if (zip) {
		doitz(skipheader);   // index file always present
	} else {
		doit(skipheader, index_file);
	}
	return EXIT_SUCCESS;
}